

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall DifferingTypesTest::constructionTest(DifferingTypesTest *this)

{
  short sVar1;
  short sVar2;
  int iVar3;
  reference psVar4;
  reference piVar5;
  logic_error *plVar6;
  ulong uVar7;
  size_t sVar8;
  View<short,_false,_std::allocator<unsigned_long>_> v;
  Marray<int,_std::allocator<unsigned_long>_> m;
  size_t shape [3];
  allocator_type local_e9;
  undefined1 local_e8 [16];
  size_t *local_d8;
  size_t local_c0;
  ulong local_b8;
  View<int,_false,_std::allocator<unsigned_long>_> local_a0;
  unsigned_long local_58 [3];
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  local_40;
  
  local_58[0] = 3;
  local_58[1] = 2;
  local_58[2] = 4;
  local_e8._0_8_ = this->dataShort_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),local_58,
             (unsigned_long *)&local_40,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a0);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
             (View<short,_false,_std::allocator<unsigned_long>_> *)local_e8);
  if (local_b8 != local_a0.geometry_.size_) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_b8 == 0) {
    uVar7 = 0;
  }
  else {
    sVar8 = 0;
    do {
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_e8,sVar8);
      sVar1 = *psVar4;
      piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&local_a0,sVar8)
      ;
      if (*piVar5 != (int)sVar1) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 < local_b8);
    uVar7 = local_a0.geometry_.size_ << 2;
  }
  operator_delete(local_a0.data_,uVar7);
  operator_delete(local_a0.geometry_.shape_,local_a0.geometry_.dimension_ * 0x18);
  operator_delete(local_d8,local_c0 * 0x18);
  local_58[0] = 3;
  local_58[1] = 2;
  local_58[2] = 4;
  local_e8._0_8_ = this->dataShort_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_e8 + 8),local_58,
             (unsigned_long *)&local_40,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_a0);
  andres::View<short,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<short,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>
  ::BinaryViewExpression
            (&local_40,
             (ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short> *)
             local_e8,(ViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short>
                       *)local_e8);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<short,false,std::allocator<unsigned_long>>,short,andres::View<short,false,std::allocator<unsigned_long>>,short,andres::marray_detail::Plus<short,short,short>>,short>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_a0,
             (ViewExpression<andres::BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::marray_detail::Plus<short,_short,_short>_>,_short>
              *)&local_40,&local_e9);
  if (local_b8 != local_a0.geometry_.size_) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_b8 == 0) {
    uVar7 = 0;
  }
  else {
    sVar8 = 0;
    do {
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_e8,sVar8);
      sVar1 = *psVar4;
      psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                         ((View<short,_false,_std::allocator<unsigned_long>_> *)local_e8,sVar8);
      sVar2 = *psVar4;
      piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&local_a0,sVar8)
      ;
      if ((int)sVar2 + (int)sVar1 != *piVar5) {
        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar6,"test failed.");
        __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 < local_b8);
    uVar7 = local_a0.geometry_.size_ << 2;
  }
  operator_delete(local_a0.data_,uVar7);
  operator_delete(local_a0.geometry_.shape_,local_a0.geometry_.dimension_ * 0x18);
  operator_delete(local_d8,local_c0 * 0x18);
  local_58[0] = 3;
  local_58[1] = 2;
  local_58[2] = 4;
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffff0000;
  andres::Marray<short,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<short,std::allocator<unsigned_long>> *)&local_a0,local_58,
             (unsigned_long *)&local_40,(short *)local_e8,&andres::defaultOrder,
             (allocator_type *)&local_40);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<short,false,std::allocator<unsigned_long>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_e8,
             (View<short,_false,_std::allocator<unsigned_long>_> *)&local_a0);
  if (local_b8 == local_a0.geometry_.size_) {
    if (local_b8 == 0) {
      local_b8 = 0;
    }
    else {
      sVar8 = 0;
      do {
        piVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,sVar8);
        iVar3 = *piVar5;
        psVar4 = andres::View<short,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<short,_false,_std::allocator<unsigned_long>_> *)&local_a0,sVar8);
        if (iVar3 != *psVar4) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar6,"test failed.");
          __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 < local_b8);
      local_b8 = local_b8 << 2;
    }
    operator_delete((void *)local_e8._0_8_,local_b8);
    operator_delete(local_d8,local_c0 * 0x18);
    operator_delete(local_a0.data_,local_a0.geometry_.size_ * 2);
    operator_delete(local_a0.geometry_.shape_,local_a0.geometry_.dimension_ * 0x18);
    return;
  }
  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar6,"test failed.");
  __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DifferingTypesTest::constructionTest()
{
    // Marray
    {
        // from View 
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == m(j));
            }
        }
        // from ViewExpression
        {
            std::size_t shape[] = {3, 2, 4};
            andres::View<short> v(shape, shape+3, dataShort_);
            andres::Marray<int> m(v + v);
            test(v.size() == m.size());
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j)+v(j) == m(j));
            }
        }
        // from Marray
        {
            std::size_t shape[] = {3, 2, 4};
            andres::Marray<short> m(shape, shape+3);
            andres::Marray<int> n(m);
            test(n.size() == m.size());
            for(std::size_t j=0; j<n.size(); ++j) {
                test(n(j) == m(j));
            }
        }
    }
}